

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O3

void __thiscall QSimplexConstraint::invert(QSimplexConstraint *this)

{
  Span *pSVar1;
  ulong uVar2;
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *d;
  ulong uVar3;
  
  this->constant = -this->constant;
  this->ratio = MoreOrEqual - this->ratio;
  d = (this->variables).d;
  if (d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0) {
    d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
    uVar3 = 0;
  }
  else {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::detached(d);
      (this->variables).d = d;
    }
    if (d->spans->offsets[0] != 0xff) {
      uVar3 = 0;
      goto LAB_00644016;
    }
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (d->numBuckets == uVar3) {
        d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
        uVar3 = 0;
        break;
      }
      uVar2 = uVar3 + 1;
    } while (d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  }
  if (uVar3 == 0 && d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0) {
    return;
  }
LAB_00644016:
  do {
    pSVar1 = d->spans;
    *(ulong *)(pSVar1[uVar3 >> 7].entries[pSVar1[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.
               data + 8) =
         *(ulong *)(pSVar1[uVar3 >> 7].entries[pSVar1[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].
                    storage.data + 8) ^ 0x8000000000000000;
    do {
      if (d->numBuckets - 1 == uVar3) {
        uVar3 = 0;
        d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pSVar1[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    if ((uVar3 == 0) && (d == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0)) {
      return;
    }
  } while( true );
}

Assistant:

void QSimplexConstraint::invert()
{
    constant = -constant;
    ratio = Ratio(2 - ratio);

    for (auto iter = variables.begin(); iter != variables.end(); ++iter)
        iter.value() = -iter.value();
}